

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# laswriteitemcompressed_v2.cpp
# Opt level: O3

int __thiscall
LASwriteItemCompressed_POINT10_v2::init(LASwriteItemCompressed_POINT10_v2 *this,EVP_PKEY_CTX *ctx)

{
  undefined4 uVar1;
  undefined8 uVar2;
  StreamingMedian5 *pSVar3;
  ulong uVar4;
  long lVar5;
  
  pSVar3 = this->last_x_diff_median5;
  this->last_intensity[8] = 0;
  this->last_intensity[9] = 0;
  this->last_intensity[10] = 0;
  this->last_intensity[0xb] = 0;
  this->last_intensity[0xc] = 0;
  this->last_intensity[0xd] = 0;
  this->last_intensity[0xe] = 0;
  this->last_intensity[0xf] = 0;
  this->last_intensity[0] = 0;
  this->last_intensity[1] = 0;
  this->last_intensity[2] = 0;
  this->last_intensity[3] = 0;
  this->last_intensity[4] = 0;
  this->last_intensity[5] = 0;
  this->last_intensity[6] = 0;
  this->last_intensity[7] = 0;
  uVar4 = 0;
  do {
    pSVar3->values[4] = 0;
    pSVar3->values[0] = 0;
    pSVar3->values[1] = 0;
    pSVar3->values[2] = 0;
    pSVar3->values[3] = 0;
    pSVar3->high = true;
    pSVar3[0x10].values[0] = 0;
    pSVar3[0x10].values[1] = 0;
    pSVar3[0x10].values[2] = 0;
    pSVar3[0x10].values[3] = 0;
    pSVar3[0x10].values[4] = 0;
    pSVar3[0x10].high = true;
    this->last_height[uVar4 >> 1 & 0x7fffffff] = 0;
    uVar4 = uVar4 + 1;
    pSVar3 = pSVar3 + 1;
  } while (uVar4 != 0x10);
  ArithmeticEncoder::initSymbolModel(this->enc,this->m_changed_values,(U32 *)0x0);
  IntegerCompressor::initCompressor(this->ic_intensity);
  ArithmeticEncoder::initSymbolModel(this->enc,this->m_scan_angle_rank[0],(U32 *)0x0);
  ArithmeticEncoder::initSymbolModel(this->enc,this->m_scan_angle_rank[1],(U32 *)0x0);
  IntegerCompressor::initCompressor(this->ic_point_source_ID);
  lVar5 = -0x100;
  do {
    if (this->m_classification[lVar5] != (ArithmeticModel *)0x0) {
      ArithmeticEncoder::initSymbolModel(this->enc,this->m_classification[lVar5],(U32 *)0x0);
    }
    if (this->m_user_data[lVar5] != (ArithmeticModel *)0x0) {
      ArithmeticEncoder::initSymbolModel(this->enc,this->m_user_data[lVar5],(U32 *)0x0);
    }
    if ((&this->ic_dx)[lVar5] != (IntegerCompressor *)0x0) {
      ArithmeticEncoder::initSymbolModel
                (this->enc,(ArithmeticModel *)(&this->ic_dx)[lVar5],(U32 *)0x0);
    }
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0);
  IntegerCompressor::initCompressor(this->ic_dx);
  IntegerCompressor::initCompressor(this->ic_dy);
  IntegerCompressor::initCompressor(this->ic_z);
  uVar1 = *(undefined4 *)(ctx + 0x10);
  *(undefined4 *)(this->last_item + 0x10) = uVar1;
  uVar2 = *(undefined8 *)(ctx + 8);
  *(undefined8 *)this->last_item = *(undefined8 *)ctx;
  *(undefined8 *)(this->last_item + 8) = uVar2;
  return (int)CONCAT71((uint7)(uint3)((uint)uVar1 >> 8),1);
}

Assistant:

BOOL LASwriteItemCompressed_POINT10_v2::init(const U8* item, U32& context)
{
  U32 i;

  /* init state */
  for (i=0; i < 16; i++)
  {
    last_x_diff_median5[i].init();
    last_y_diff_median5[i].init();
    last_intensity[i] = 0;
    last_height[i/2] = 0;
  }

  /* init models and integer compressors */
  enc->initSymbolModel(m_changed_values);
  ic_intensity->initCompressor();
  enc->initSymbolModel(m_scan_angle_rank[0]);
  enc->initSymbolModel(m_scan_angle_rank[1]);
  ic_point_source_ID->initCompressor();
  for (i = 0; i < 256; i++)
  {
    if (m_bit_byte[i]) enc->initSymbolModel(m_bit_byte[i]);
    if (m_classification[i]) enc->initSymbolModel(m_classification[i]);
    if (m_user_data[i]) enc->initSymbolModel(m_user_data[i]);
  }
  ic_dx->initCompressor();
  ic_dy->initCompressor();
  ic_z->initCompressor();

  /* init last item */
  memcpy(last_item, item, 20);

  return TRUE;
}